

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O1

double __thiscall RandomGen::rand_skewGauss(RandomGen *this,double xi,double omega,double alpha)

{
  long lVar1;
  ulong uVar2;
  RandomGen *pRVar3;
  ulong uVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar11 = alpha * alpha + 1.0;
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  dVar11 = alpha / dVar11;
  dVar6 = dVar11 * 0.7978845608028654;
  dVar7 = pow(dVar6,3.0);
  dVar8 = pow(((dVar11 + dVar11) * dVar11) / -3.141592653589793 + 1.0,1.5);
  dVar11 = 1.0 - dVar6 * dVar6;
  if (dVar11 < 0.0) {
    dVar12 = sqrt(dVar11);
    dVar11 = dVar12;
  }
  else {
    dVar12 = SQRT(dVar11);
  }
  dVar7 = (dVar7 / dVar8) * 0.42920367320510344;
  if (0.0 < alpha) {
    dVar11 = exp(-6.283185307179586 / alpha);
    dVar11 = dVar11 * -0.5 + dVar7 * -0.5 * dVar12 + dVar6;
  }
  if (alpha < 0.0) {
    dVar11 = exp(6.283185307179586 / alpha);
    dVar11 = dVar11 * 0.5 + dVar7 * -0.5 * dVar12 + dVar6;
  }
  dVar11 = (dVar11 * omega + xi) - xi;
  dVar6 = dVar11 / omega;
  dVar6 = exp(dVar6 * dVar6 * -0.5);
  dVar11 = erfc(((dVar11 * alpha) / omega) / -1.414213562373095);
  dVar7 = omega * -6.0 + xi;
  bVar5 = false;
  do {
    if (m_pInstance == (RandomGen *)0x0) {
      m_pInstance = (RandomGen *)operator_new(0x18);
      (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_ =
           0xc1f651c67c62c6e0;
      (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_ =
           0x30d89576f866ac9f;
      m_pInstance->rng_locked = false;
    }
    pRVar3 = m_pInstance;
    uVar2 = (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_;
    uVar4 = (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_;
    lVar1 = uVar4 + uVar2;
    uVar4 = uVar4 ^ uVar2;
    (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_ =
         uVar4 << 0x10 ^ (uVar2 << 0x18 | uVar2 >> 0x28) ^ uVar4;
    (pRVar3->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_ =
         uVar4 << 0x25 | uVar4 >> 0x1b;
    pRVar3 = m_pInstance;
    auVar9._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar9._0_8_ = lVar1;
    auVar9._12_4_ = 0x45300000;
    dVar13 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 5.421010862427522e-20
             * ((omega * 6.0 + xi) - dVar7) + dVar7;
    uVar2 = (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_;
    uVar4 = (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_;
    lVar1 = uVar4 + uVar2;
    uVar4 = uVar4 ^ uVar2;
    (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_ =
         uVar4 << 0x10 ^ (uVar2 << 0x18 | uVar2 >> 0x28) ^ uVar4;
    (pRVar3->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_ =
         uVar4 << 0x25 | uVar4 >> 0x1b;
    auVar10._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar10._0_8_ = lVar1;
    auVar10._12_4_ = 0x45300000;
    dVar8 = dVar13 - xi;
    dVar12 = dVar8 / omega;
    dVar12 = exp(dVar12 * dVar12 * -0.5);
    dVar8 = erfc(((dVar8 * -alpha) / omega) / 1.414213562373095);
    if (((auVar10._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 5.421010862427522e-20 *
        dVar11 * (dVar6 / (omega * 2.5066282746310007)) <=
        dVar8 * (dVar12 / (omega * 2.5066282746310007))) {
      bVar5 = true;
    }
  } while (!bVar5);
  return dVar13;
}

Assistant:

double RandomGen::rand_skewGauss(double xi, double omega, double alpha) {
  double delta = alpha / sqrt(1 + alpha * alpha);
  double gamma1 = four_minus_PI_div_2 *
                  (pow(delta * sqrt2_div_PI, 3.) /
                   pow(1 - 2. * delta * delta / M_PI, 1.5));  // skewness
  double muz = delta * sqrt2_div_PI;
  double sigz = sqrt(1. - muz * muz);
  double m_o;
  if (alpha > 0.) {
    m_o = muz - 0.5 * gamma1 * sigz - 0.5 * exp(-two_PI / alpha);
  }
  if (alpha < 0.) {
    m_o = muz - 0.5 * gamma1 * sigz + 0.5 * exp(two_PI / alpha);
  }
  double mode = xi + omega * m_o;
  // the height should be the value of the PDF at the mode
  double height = exp(-0.5 * (pow((mode - xi) / omega, 2.))) /
                  (sqrt2_PI * omega) *
                  erfc(-1. * alpha * (mode - xi) / omega / sqrt2);
  bool gotValue = false;
  double minX = xi - 6. * omega;
  double maxX =
      xi + 6. * omega;  // +/- 6sigma should be essentially +/- infinity
                        //  can increase these for even better accuracy, at the
                        //  cost of speed
  double testX, testY, testProb;
  while (gotValue == false) {
    testX = minX + (maxX - minX) * RandomGen::rndm()->rand_uniform();
    testY = height *
            RandomGen::rndm()->rand_uniform();  // between 0 and peak height
    // calculate the value of the skewGauss PDF at the test x-value
    testProb = exp(-0.5 * (pow((testX - xi) / omega, 2.))) /
               (sqrt2_PI * omega) *
               erfc(-1. * alpha * (testX - xi) / omega / sqrt2);
    if (testProb >= testY) {
      gotValue = true;
    }
  }
  return testX;
}